

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NIsNodeInNodeset(void *user_data,xmlNodePtr node,xmlNodePtr parent)

{
  undefined1 local_60 [8];
  xmlNs ns;
  xmlNodeSetPtr nodes;
  xmlNodePtr parent_local;
  xmlNodePtr node_local;
  void *user_data_local;
  
  if ((user_data == (void *)0x0) || (node == (xmlNodePtr)0x0)) {
    user_data_local._4_4_ = 1;
  }
  else {
    ns.context = (_xmlDoc *)user_data;
    if (node->type == XML_NAMESPACE_DECL) {
      memcpy(local_60,node,0x30);
      local_60 = (undefined1  [8])parent;
      if ((parent != (xmlNodePtr)0x0) && (parent->type == XML_ATTRIBUTE_NODE)) {
        local_60 = (undefined1  [8])parent->parent;
      }
      user_data_local._4_4_ =
           xmlXPathNodeSetContains((xmlNodeSetPtr)ns.context,(xmlNodePtr)local_60);
    }
    else {
      user_data_local._4_4_ = xmlXPathNodeSetContains((xmlNodeSetPtr)user_data,node);
    }
  }
  return user_data_local._4_4_;
}

Assistant:

static int
xmlC14NIsNodeInNodeset(void *user_data, xmlNodePtr node, xmlNodePtr parent) {
    xmlNodeSetPtr nodes = (xmlNodeSetPtr) user_data;
    if((nodes != NULL) && (node != NULL)) {
	if(node->type != XML_NAMESPACE_DECL) {
	    return(xmlXPathNodeSetContains(nodes, node));
	} else {
	    xmlNs ns;

	    memcpy(&ns, node, sizeof(ns));

	    /* this is a libxml hack! check xpath.c for details */
	    if((parent != NULL) && (parent->type == XML_ATTRIBUTE_NODE)) {
		ns.next = (xmlNsPtr)parent->parent;
	    } else {
		ns.next = (xmlNsPtr)parent;
	    }

	    /*
	     * If the input is an XPath node-set, then the node-set must explicitly
	     * contain every node to be rendered to the canonical form.
	     */
	    return(xmlXPathNodeSetContains(nodes, (xmlNodePtr)&ns));
	}
    }
    return(1);
}